

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat3.c
# Opt level: O0

void glmc_mat3_mul(vec3 *m1,vec3 *m2,vec3 *dest)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  __m128 afVar9;
  __m128 afVar10;
  __m128 afVar11;
  __m128 afVar12;
  __m128 b;
  __m128 b_00;
  __m128 b_01;
  __m128 b_02;
  __m128 c;
  __m128 c_00;
  __m128 c_01;
  __m128 c_02;
  __m128 x9;
  __m128 x8;
  __m128 x7;
  __m128 x6;
  __m128 x5;
  __m128 x4;
  __m128 x3;
  __m128 x2;
  __m128 x1;
  __m128 x0;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 l2;
  __m128 l1;
  __m128 l0;
  undefined8 *puVar13;
  undefined8 local_428;
  undefined1 local_408 [12];
  undefined4 uStack_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined4 uStack_3c4;
  undefined4 uStack_3b4;
  undefined4 local_398;
  undefined4 uStack_37c;
  undefined4 local_238;
  float local_1b8;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float local_188;
  float fStack_184;
  float local_18;
  __m128 a;
  __m128 a_00;
  
  uVar3 = *(undefined8 *)in_RDI[1];
  uVar4 = *(undefined8 *)*(undefined1 (*) [12])(in_RDI[1] + 8);
  uVar5 = in_RSI[1];
  uVar6 = in_RSI[2];
  local_1a8 = (float)*(undefined8 *)*in_RDI;
  fStack_1a4 = (float)((ulong)*(undefined8 *)*in_RDI >> 0x20);
  local_1b8 = (float)*in_RSI;
  fStack_1ac = (float)((ulong)uVar5 >> 0x20);
  uStack_37c = (undefined4)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
  local_398 = (undefined4)uVar3;
  uStack_3b4 = (undefined4)((ulong)*in_RSI >> 0x20);
  uStack_3fc = *(undefined4 *)in_RDI[2];
  local_408 = *(undefined1 (*) [12])(in_RDI[1] + 8);
  local_188 = SUB164(*in_RDI,4);
  fStack_184 = SUB164(*in_RDI,8);
  afVar11[1] = (float)local_398;
  afVar11[0] = (float)uStack_37c;
  afVar11[3] = (float)uStack_3b4;
  afVar11[2] = (float)uStack_3b4;
  local_238 = (undefined4)uVar6;
  afVar12[3] = (float)local_238;
  afVar12[2] = (float)local_238;
  b._8_8_ = in_XMM3_Qa;
  b[0] = local_1a8 * local_1b8;
  b[1] = fStack_1a4 * local_1b8;
  c._8_8_ = in_XMM5_Qa;
  c._0_8_ = in_XMM4_Qa;
  puVar13 = in_RDX;
  afVar9 = glmm_fmadd(afVar11,b,c);
  afVar12[0] = (float)(int)uVar3;
  afVar12[1] = (float)(int)((ulong)uVar3 >> 0x20);
  b_00[2] = (float)(int)in_XMM3_Qa;
  b_00[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_00[0] = local_188 * fStack_1ac;
  b_00[1] = fStack_184 * fStack_1ac;
  c_00[2] = (float)(int)in_XMM5_Qa;
  c_00[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_00[0] = (float)(int)in_XMM4_Qa;
  c_00[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar10 = glmm_fmadd(afVar12,b_00,c_00);
  auVar7._8_8_ = stack0xfffffffffffffc00;
  auVar7._0_8_ = uVar4;
  uStack_3c4 = (undefined4)((ulong)uVar6 >> 0x20);
  uVar8 = (undefined4)uVar5;
  a[3] = (float)uVar8;
  a[2] = (float)uVar8;
  a[0] = (float)(int)uVar4;
  a[1] = (float)(int)((ulong)uVar4 >> 0x20);
  b_01[2] = (float)(int)in_XMM3_Qa;
  b_01[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_01[0] = (float)(int)afVar9._0_8_;
  b_01[1] = (float)(int)((ulong)afVar9._0_8_ >> 0x20);
  c_01[2] = (float)(int)in_XMM5_Qa;
  c_01[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_01[0] = (float)(int)in_XMM4_Qa;
  c_01[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar11 = glmm_fmadd(a,b_01,c_01);
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._0_8_ = afVar11._0_8_;
  auVar1._12_4_ = extraout_XMM0_Dd;
  a_00[2] = (float)uStack_3c4;
  a_00[3] = (float)uStack_3c4;
  a_00[0] = (float)(int)auVar7._4_8_;
  a_00[1] = (float)(int)((ulong)auVar7._4_8_ >> 0x20);
  b_02[2] = (float)(int)in_XMM3_Qa;
  b_02[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_02[0] = (float)(int)afVar10._0_8_;
  b_02[1] = (float)(int)((ulong)afVar10._0_8_ >> 0x20);
  c_02[2] = (float)(int)in_XMM5_Qa;
  c_02[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_02[0] = (float)(int)in_XMM4_Qa;
  c_02[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar12 = glmm_fmadd(a_00,b_02,c_02);
  auVar2._8_4_ = extraout_XMM0_Dc_00;
  auVar2._0_8_ = afVar12._0_8_;
  auVar2._12_4_ = extraout_XMM0_Dd_00;
  afVar10._8_8_ = in_RDI;
  afVar10._0_8_ = in_RSI;
  afVar9._8_8_ = puVar13;
  afVar9[0] = 1.826218e-39;
  afVar9[1] = 0.0;
  afVar9 = glmm_vdots(afVar10,afVar9);
  uStack_3e0 = auVar1._8_8_;
  *in_RDX = afVar11._0_8_;
  in_RDX[1] = uStack_3e0;
  uStack_3f0 = auVar2._8_8_;
  in_RDX[2] = afVar12._0_8_;
  in_RDX[3] = uStack_3f0;
  local_18 = afVar9[0];
  *(float *)(in_RDX + 4) = local_18;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat3_mul(mat3 m1, mat3 m2, mat3 dest) {
  glm_mat3_mul(m1, m2, dest);
}